

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  uint maxTurnCount;
  Type *in_RCX;
  int local_f0;
  bool local_ea;
  char local_e9;
  bool _kj_shouldLog;
  char *pcStack_e8;
  char c;
  char *__end2;
  char *__begin2;
  String *__range2;
  undefined1 local_c8 [4];
  uint lines;
  String trace;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:189:44),_kj::Promise<void>_>
  local_a8;
  Promise<void> local_90;
  uint local_7c;
  undefined1 local_78 [4];
  uint i;
  Promise<void> promise;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase181 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  _::NeverDone::operator_cast_to_Promise((NeverDone *)local_78);
  for (local_7c = 0; local_7c < 1000; local_7c = local_7c + 1) {
    mvCapture<kj::(anonymous_namespace)::TestCase181::run()::__0,kj::Promise<void>&>
              (&local_a8,(kj *)local_78,(Promise<void> *)((long)&trace.content.disposer + 7),in_RCX)
    ;
    evalLater<kj::CaptureByMove<kj::(anonymous_namespace)::TestCase181::run()::__0,kj::Promise<void>>>
              ((kj *)&local_90,&local_a8);
    Promise<void>::operator=((Promise<void> *)local_78,&local_90);
    Promise<void>::~Promise(&local_90);
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:189:44),_kj::Promise<void>_>
    ::~CaptureByMove(&local_a8);
  }
  maxTurnCount = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  EventLoop::run((EventLoop *)&waitScope.busyPollInterval,maxTurnCount);
  Promise<void>::trace((String *)local_c8,(Promise<void> *)local_78);
  __range2._4_4_ = 0;
  __begin2 = local_c8;
  __end2 = String::begin((String *)__begin2);
  pcStack_e8 = String::end((String *)__begin2);
  for (; __end2 != pcStack_e8; __end2 = __end2 + 1) {
    local_e9 = *__end2;
    __range2._4_4_ = (local_e9 == '\n') + __range2._4_4_;
  }
  if (4 < __range2._4_4_) {
    local_ea = _::Debug::shouldLog(ERROR);
    while (local_ea != false) {
      local_f0 = 5;
      _::Debug::log<char_const(&)[31],unsigned_int&,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"(lines) < (5)\", lines, 5",
                 (char (*) [31])"failed: expected (lines) < (5)",(uint *)((long)&__range2 + 4),
                 &local_f0);
      local_ea = false;
    }
  }
  String::~String((String *)local_c8);
  Promise<void>::~Promise((Promise<void> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, DeepChain) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = NEVER_DONE;

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}